

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D::forward(Convolution1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  Option *opt_00;
  Mat local_68;
  
  local_68.cstep = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.elemsize._0_4_ = 0;
  local_68.elemsize._4_4_ = 0;
  local_68.elempack = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.d = 0;
  local_68.c = 0;
  make_padding(this,bottom_blob,&local_68,this->kernel_w,opt);
  iVar2 = -100;
  if ((local_68.data != (void *)0x0) && ((long)local_68.c * local_68.cstep != 0)) {
    opt_00 = (Option *)0x303ebd;
    Mat::create(top_blob,(~((this->kernel_w + -1) * this->dilation_w) + local_68.w) / this->stride_w
                         + 1,this->num_output,
                CONCAT44(local_68.elemsize._4_4_,(undefined4)local_68.elemsize),opt->blob_allocator)
    ;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      convolution1d(&local_68,top_blob,(Mat *)(this->weight_data).data,&this->bias_data,
                    this->kernel_w,this->stride_w,this->dilation_w,this->activation_type,
                    (Mat *)(this->activation_params).data,opt_00);
      iVar2 = 0;
    }
  }
  piVar1 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_68.allocator == (Allocator *)0x0) {
        if (local_68.data != (void *)0x0) {
          free(local_68.data);
        }
      }
      else {
        (*(local_68.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar2;
}

Assistant:

int Convolution1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;

    top_blob.create(outw, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolution1d(bottom_blob_bordered, top_blob, weight_data, bias_data, kernel_w, stride_w, dilation_w, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}